

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lobject.c
# Opt level: O1

void luaO_tostring(lua_State *L,StkId obj)

{
  int iVar1;
  size_t sVar2;
  lconv *plVar3;
  TString *pTVar4;
  TValue *io;
  size_t l;
  char buff [50];
  char acStack_58 [56];
  
  if (obj->tt_ == 0x13) {
    iVar1 = snprintf(acStack_58,0x32,"%lld",(obj->value_).gc);
    l = (size_t)iVar1;
  }
  else {
    iVar1 = snprintf(acStack_58,0x32,"%.14g",(obj->value_).gc);
    l = (size_t)iVar1;
    sVar2 = strspn(acStack_58,"-0123456789");
    if (acStack_58[sVar2] == '\0') {
      plVar3 = localeconv();
      acStack_58[l] = *plVar3->decimal_point;
      acStack_58[l + 1] = '0';
      l = l + 2;
    }
  }
  pTVar4 = luaS_newlstr(L,acStack_58,l);
  (obj->value_).gc = (GCObject *)pTVar4;
  obj->tt_ = pTVar4->tt | 0x40;
  return;
}

Assistant:

void luaO_tostring(lua_State *L, StkId obj) {
    char buff[MAXNUMBER2STR];
    size_t len;
    lua_assert(ttisnumber(obj));
    if (ttisinteger(obj))
        len = lua_integer2str(buff, sizeof(buff), ivalue(obj));
    else {
        len = lua_number2str(buff, sizeof(buff), fltvalue(obj));
#if !defined(LUA_COMPAT_FLOATSTRING)
        if (buff[strspn(buff, "-0123456789")] == '\0') {  /* looks like an int? */
            buff[len++] = lua_getlocaledecpoint();
            buff[len++] = '0';  /* adds '.0' to result */
        }
#endif
    }
    setsvalue2s(L, obj, luaS_newlstr(L, buff, len));
}